

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool duckdb::HugeIntegerCastOperation::
     HandleDigit<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,true>
               (HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long> *state,uint8_t digit)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  undefined3 in_register_00000031;
  
  lVar2 = state->intermediate;
  uVar3 = (0x8000000000000000 - (ulong)CONCAT31(in_register_00000031,digit)) / 10;
  if (SBORROW8(lVar2,-uVar3) != (long)(lVar2 + uVar3) < 0) {
    bVar1 = HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long>::Flush(state);
    if (!bVar1) {
      return false;
    }
    lVar2 = state->intermediate;
  }
  state->intermediate = lVar2 * 10 - (ulong)CONCAT31(in_register_00000031,digit);
  state->digits = state->digits + '\x01';
  return true;
}

Assistant:

static bool HandleDigit(T &state, uint8_t digit) {
		if (NEGATIVE) {
			if (DUCKDB_UNLIKELY(state.intermediate <
			                    (NumericLimits<typename T::IntermediateType>::Minimum() + digit) / 10)) {
				// intermediate is full: need to flush it
				if (!state.Flush()) {
					return false;
				}
			}
			state.intermediate = state.intermediate * 10 - digit;
		} else {
			if (DUCKDB_UNLIKELY(state.intermediate >
			                    (NumericLimits<typename T::IntermediateType>::Maximum() - digit) / 10)) {
				if (!state.Flush()) {
					return false;
				}
			}
			state.intermediate = state.intermediate * 10 + digit;
		}
		state.digits++;
		return true;
	}